

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void Js::EnsureBuiltInEngineIsReady(JsBuiltInFile file,ScriptContext *scriptContext)

{
  EngineInterfaceObject *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JsBuiltInEngineInterfaceExtensionObject *this_00;
  
  bVar2 = ScriptContext::IsJsBuiltInEnabled(scriptContext);
  if (bVar2) {
    BVar3 = ScriptContext::VerifyAlive(scriptContext,0,(ScriptContext *)0x0);
    if (BVar3 != 0) {
      this = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).engineInterfaceObject.ptr;
      if (this == (EngineInterfaceObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                    ,0x789,"(engineInterfaceObject != nullptr)",
                                    "engineInterfaceObject != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      this_00 = (JsBuiltInEngineInterfaceExtensionObject *)
                EngineInterfaceObject::GetEngineExtension
                          (this,EngineInterfaceExtensionKind_JsBuiltIn);
      JsBuiltInEngineInterfaceExtensionObject::InjectJsBuiltInLibraryCode
                (this_00,scriptContext,file);
      return;
    }
  }
  return;
}

Assistant:

void EnsureBuiltInEngineIsReady(JsBuiltInFile file, ScriptContext* scriptContext)
    {
        if (scriptContext->IsJsBuiltInEnabled())
        {
            if (scriptContext->VerifyAlive())  // Can't initialize if scriptContext closed, will need to run script
            {
                EngineInterfaceObject* engineInterfaceObject = scriptContext->GetLibrary()->GetEngineInterfaceObject();
                Assert(engineInterfaceObject != nullptr);
                JsBuiltInEngineInterfaceExtensionObject* builtInExtension =
                    static_cast<JsBuiltInEngineInterfaceExtensionObject*>(engineInterfaceObject->GetEngineExtension(EngineInterfaceExtensionKind_JsBuiltIn));
                builtInExtension->InjectJsBuiltInLibraryCode(scriptContext, file);
            }
        }
    }